

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjpeg.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  JDIMENSION JVar3;
  FILE *__stream;
  FILE *__stream_00;
  size_t __size;
  void *__ptr;
  size_t sVar4;
  cjpeg_source_ptr pcVar5;
  char *pcVar6;
  char *__format;
  boolean in_R8D;
  FILE *local_338;
  unsigned_long outsize;
  uchar *outbuffer;
  char **local_320;
  jpeg_compress_struct cinfo;
  cdjpeg_progress_mgr progress;
  jpeg_error_mgr jerr;
  
  outbuffer = (uchar *)0x0;
  outsize = 0;
  progname = *argv;
  if ((progname == (char *)0x0) || (*progname == '\0')) {
    progname = "cjpeg";
  }
  cinfo.err = (jpeg_error_mgr *)jpeg_std_error(&jerr);
  jpeg_CreateCompress(&cinfo,0x3e,0x208);
  jerr.addon_message_table = cdjpeg_message_table;
  jerr.first_addon_message = 1000;
  jerr.last_addon_message = 0x417;
  cinfo.in_color_space = JCS_RGB;
  jpeg_set_defaults(&cinfo);
  iVar1 = parse_switches(&cinfo,argc,argv,0,in_R8D);
  if (iVar1 < argc + -1) {
    fprintf(_stderr,"%s: only one input file\n",progname);
    usage();
    pcVar6 = icc_filename;
LAB_001027f8:
    __format = "%s: can\'t open %s\n";
  }
  else {
    if (iVar1 < argc) {
      __stream = fopen(argv[iVar1],"rb");
      if (__stream == (FILE *)0x0) {
        pcVar6 = argv[iVar1];
        goto LAB_001027f8;
      }
    }
    else {
      __stream = (FILE *)read_stdin();
    }
    if (outfilename == (char *)0x0) {
      if (memdst == 0) {
        local_338 = (FILE *)write_stdout();
      }
      else {
        local_338 = (FILE *)0x0;
      }
    }
    else {
      local_338 = fopen(outfilename,"wb");
      pcVar6 = outfilename;
      if (local_338 == (FILE *)0x0) goto LAB_001027f8;
    }
    local_320 = argv;
    if (icc_filename == (char *)0x0) {
      __ptr = (void *)0x0;
      __size = 0;
LAB_0010254a:
      if (report != 0) {
        start_progress_monitor((j_common_ptr)&cinfo,&progress);
        progress.report = report;
      }
      if (is_targa != '\x01') {
        iVar1 = getc(__stream);
        if (iVar1 == -1) {
          (cinfo.err)->msg_code = 0x2a;
          (*(cinfo.err)->error_exit)((j_common_ptr)&cinfo);
        }
        iVar2 = ungetc(iVar1,__stream);
        if (iVar2 == -1) {
          (cinfo.err)->msg_code = 0x414;
          (*(cinfo.err)->error_exit)((j_common_ptr)&cinfo);
        }
        if (iVar1 != 0) {
          if (iVar1 == 0x50) {
            pcVar5 = jinit_read_ppm(&cinfo);
          }
          else if (iVar1 == 0x47) {
            pcVar5 = jinit_read_gif(&cinfo);
          }
          else if (iVar1 == 0x42) {
            pcVar5 = jinit_read_bmp(&cinfo,1);
          }
          else {
            (cinfo.err)->msg_code = 0x415;
            (*(cinfo.err)->error_exit)((j_common_ptr)&cinfo);
            pcVar5 = (cjpeg_source_ptr)0x0;
          }
          goto LAB_00102588;
        }
      }
      pcVar5 = jinit_read_targa(&cinfo);
LAB_00102588:
      pcVar5->input_file = (FILE *)__stream;
      (*pcVar5->start_input)(&cinfo,pcVar5);
      jpeg_default_colorspace(&cinfo);
      parse_switches(&cinfo,argc,local_320,1,in_R8D);
      if (memdst == 0) {
        jpeg_stdio_dest(&cinfo,local_338);
      }
      else {
        jpeg_mem_dest(&cinfo,&outbuffer,&outsize);
      }
      jpeg_start_compress(&cinfo,1);
      if (__ptr != (void *)0x0) {
        jpeg_write_icc_profile(&cinfo,__ptr,__size & 0xffffffff);
      }
      while (cinfo.next_scanline < cinfo.image_height) {
        JVar3 = (*pcVar5->get_pixel_rows)(&cinfo,pcVar5);
        jpeg_write_scanlines(&cinfo,pcVar5->buffer,JVar3);
      }
      (*pcVar5->finish_input)(&cinfo,pcVar5);
      jpeg_finish_compress(&cinfo);
      jpeg_destroy_compress(&cinfo);
      if (__stream != _stdin) {
        fclose(__stream);
      }
      if ((local_338 != (FILE *)0x0) && (local_338 != _stdout)) {
        fclose(local_338);
      }
      if (report != 0) {
        end_progress_monitor((j_common_ptr)&cinfo);
      }
      if (memdst != 0) {
        fprintf(_stderr,"Compressed size:  %lu bytes\n",outsize);
        free(outbuffer);
      }
      free(__ptr);
      return (uint)(jerr.num_warnings != 0) * 2;
    }
    __stream_00 = fopen(icc_filename,"rb");
    pcVar6 = icc_filename;
    if (__stream_00 == (FILE *)0x0) goto LAB_001027f8;
    iVar1 = fseek(__stream_00,0,2);
    if (((-1 < iVar1) && (__size = ftell(__stream_00), 0 < (long)__size)) &&
       (iVar1 = fseek(__stream_00,0,0), -1 < iVar1)) {
      __ptr = malloc(__size);
      if (__ptr == (void *)0x0) {
        fprintf(_stderr,"%s: can\'t allocate memory for ICC profile\n",progname);
      }
      else {
        sVar4 = fread(__ptr,__size,1,__stream_00);
        if (sVar4 != 0) {
          fclose(__stream_00);
          goto LAB_0010254a;
        }
        fprintf(_stderr,"%s: can\'t read ICC profile from %s\n",progname,icc_filename);
        free(__ptr);
      }
      fclose(__stream_00);
      goto LAB_0010285f;
    }
    __format = "%s: can\'t determine size of %s\n";
    pcVar6 = icc_filename;
  }
  fprintf(_stderr,__format,progname,pcVar6);
LAB_0010285f:
  exit(1);
}

Assistant:

int
main(int argc, char **argv)
{
  struct jpeg_compress_struct cinfo;
#ifdef CJPEG_FUZZER
  struct my_error_mgr myerr;
  struct jpeg_error_mgr &jerr = myerr.pub;
#else
  struct jpeg_error_mgr jerr;
#endif
  struct cdjpeg_progress_mgr progress;
  int file_index;
  cjpeg_source_ptr src_mgr;
  FILE *input_file = NULL;
  FILE *icc_file;
  JOCTET *icc_profile = NULL;
  long icc_len = 0;
  FILE *output_file = NULL;
  unsigned char *outbuffer = NULL;
  unsigned long outsize = 0;
  JDIMENSION num_scanlines;

  /* On Mac, fetch a command line. */
#ifdef USE_CCOMMAND
  argc = ccommand(&argv);
#endif

  progname = argv[0];
  if (progname == NULL || progname[0] == 0)
    progname = "cjpeg";         /* in case C library doesn't provide it */

  /* Initialize the JPEG compression object with default error handling. */
  cinfo.err = jpeg_std_error(&jerr);
  jpeg_create_compress(&cinfo);
  /* Add some application-specific error messages (from cderror.h) */
  jerr.addon_message_table = cdjpeg_message_table;
  jerr.first_addon_message = JMSG_FIRSTADDONCODE;
  jerr.last_addon_message = JMSG_LASTADDONCODE;

  /* Initialize JPEG parameters.
   * Much of this may be overridden later.
   * In particular, we don't yet know the input file's color space,
   * but we need to provide some value for jpeg_set_defaults() to work.
   */

  cinfo.in_color_space = JCS_RGB; /* arbitrary guess */
  jpeg_set_defaults(&cinfo);

  /* Scan command line to find file names.
   * It is convenient to use just one switch-parsing routine, but the switch
   * values read here are ignored; we will rescan the switches after opening
   * the input file.
   */

  file_index = parse_switches(&cinfo, argc, argv, 0, FALSE);

#ifdef TWO_FILE_COMMANDLINE
  if (!memdst) {
    /* Must have either -outfile switch or explicit output file name */
    if (outfilename == NULL) {
      if (file_index != argc - 2) {
        fprintf(stderr, "%s: must name one input and one output file\n",
                progname);
        usage();
      }
      outfilename = argv[file_index + 1];
    } else {
      if (file_index != argc - 1) {
        fprintf(stderr, "%s: must name one input and one output file\n",
                progname);
        usage();
      }
    }
  }
#else
  /* Unix style: expect zero or one file name */
  if (file_index < argc - 1) {
    fprintf(stderr, "%s: only one input file\n", progname);
    usage();
  }
#endif /* TWO_FILE_COMMANDLINE */

  /* Open the input file. */
  if (file_index < argc) {
    if ((input_file = fopen(argv[file_index], READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, argv[file_index]);
      exit(EXIT_FAILURE);
    }
  } else {
    /* default input file is stdin */
    input_file = read_stdin();
  }

  /* Open the output file. */
  if (outfilename != NULL) {
    if ((output_file = fopen(outfilename, WRITE_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, outfilename);
      exit(EXIT_FAILURE);
    }
  } else if (!memdst) {
    /* default output file is stdout */
    output_file = write_stdout();
  }

  if (icc_filename != NULL) {
    if ((icc_file = fopen(icc_filename, READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, icc_filename);
      exit(EXIT_FAILURE);
    }
    if (fseek(icc_file, 0, SEEK_END) < 0 ||
        (icc_len = ftell(icc_file)) < 1 ||
        fseek(icc_file, 0, SEEK_SET) < 0) {
      fprintf(stderr, "%s: can't determine size of %s\n", progname,
              icc_filename);
      exit(EXIT_FAILURE);
    }
    if ((icc_profile = (JOCTET *)malloc(icc_len)) == NULL) {
      fprintf(stderr, "%s: can't allocate memory for ICC profile\n", progname);
      fclose(icc_file);
      exit(EXIT_FAILURE);
    }
    if (fread(icc_profile, icc_len, 1, icc_file) < 1) {
      fprintf(stderr, "%s: can't read ICC profile from %s\n", progname,
              icc_filename);
      free(icc_profile);
      fclose(icc_file);
      exit(EXIT_FAILURE);
    }
    fclose(icc_file);
  }

#ifdef CJPEG_FUZZER
  jerr.error_exit = my_error_exit;
  jerr.emit_message = my_emit_message;
  if (setjmp(myerr.setjmp_buffer))
    HANDLE_ERROR()
#endif

  if (report) {
    start_progress_monitor((j_common_ptr)&cinfo, &progress);
    progress.report = report;
  }

  /* Figure out the input file format, and set up to read it. */
  src_mgr = select_file_type(&cinfo, input_file);
  src_mgr->input_file = input_file;
#ifdef CJPEG_FUZZER
  src_mgr->max_pixels = 1048576;
#endif

  /* Read the input file header to obtain file size & colorspace. */
  (*src_mgr->start_input) (&cinfo, src_mgr);

  /* Now that we know input colorspace, fix colorspace-dependent defaults */
  jpeg_default_colorspace(&cinfo);

  /* Adjust default compression parameters by re-parsing the options */
  file_index = parse_switches(&cinfo, argc, argv, 0, TRUE);

  /* Specify data destination for compression */
#if JPEG_LIB_VERSION >= 80 || defined(MEM_SRCDST_SUPPORTED)
  if (memdst)
    jpeg_mem_dest(&cinfo, &outbuffer, &outsize);
  else
#endif
    jpeg_stdio_dest(&cinfo, output_file);

#ifdef CJPEG_FUZZER
  if (setjmp(myerr.setjmp_buffer))
    HANDLE_ERROR()
#endif

  /* Start compressor */
  jpeg_start_compress(&cinfo, TRUE);

  if (icc_profile != NULL)
    jpeg_write_icc_profile(&cinfo, icc_profile, (unsigned int)icc_len);

  /* Process data */
  while (cinfo.next_scanline < cinfo.image_height) {
    num_scanlines = (*src_mgr->get_pixel_rows) (&cinfo, src_mgr);
    (void)jpeg_write_scanlines(&cinfo, src_mgr->buffer, num_scanlines);
  }

  /* Finish compression and release memory */
  (*src_mgr->finish_input) (&cinfo, src_mgr);
  jpeg_finish_compress(&cinfo);
  jpeg_destroy_compress(&cinfo);

  /* Close files, if we opened them */
  if (input_file != stdin)
    fclose(input_file);
  if (output_file != stdout && output_file != NULL)
    fclose(output_file);

  if (report)
    end_progress_monitor((j_common_ptr)&cinfo);

  if (memdst) {
#ifndef CJPEG_FUZZER
    fprintf(stderr, "Compressed size:  %lu bytes\n", outsize);
#endif
    free(outbuffer);
  }

  free(icc_profile);

  /* All done. */
  return (jerr.num_warnings ? EXIT_WARNING : EXIT_SUCCESS);
}